

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
::ConvertFromStruct(JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
                    *this,vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
                          *list)

{
  pointer pEVar1;
  pointer data;
  ElementsDecodeRawTransactionTxIn object;
  ElementsDecodeRawTransactionTxIn EStack_2d8;
  
  pEVar1 = (list->
           super__Vector_base<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pEVar1; data = data + 1) {
    cfd::api::json::ElementsDecodeRawTransactionTxIn::ElementsDecodeRawTransactionTxIn(&EStack_2d8);
    cfd::api::json::ElementsDecodeRawTransactionTxIn::ConvertFromStruct(&EStack_2d8,data);
    ::std::
    vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
    ::push_back(&(this->super_JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxIn>).
                 super_vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
                ,&EStack_2d8);
    cfd::api::json::ElementsDecodeRawTransactionTxIn::~ElementsDecodeRawTransactionTxIn(&EStack_2d8)
    ;
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }